

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,DecodeUriOptions options)

{
  kj kVar1;
  uint uVar2;
  char *pcVar3;
  EncodingResult<kj::Array<unsigned_char>_> *pEVar4;
  size_t sVar5;
  bool bVar6;
  kj *pkVar7;
  kj *pkVar8;
  bool bVar9;
  bool bVar10;
  Vector<unsigned_char> result;
  Vector<unsigned_char> local_68;
  int local_40;
  undefined4 local_3c;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  
  pcVar3 = text.ptr;
  bVar9 = false;
  local_68.builder.ptr =
       (uchar *)_::HeapArrayDisposer::allocateImpl
                          (1,0,(size_t)(pcVar3 + ((uint)text.size_ & 1)),(_func_void_void_ptr *)0x0,
                           (_func_void_void_ptr *)0x0);
  local_68.builder.endPtr = (uchar *)(pcVar3 + ((uint)text.size_ & 1) + (long)local_68.builder.ptr);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (0 < (long)pcVar3) {
    pkVar7 = (kj *)(pcVar3 + (long)this);
    bVar6 = false;
    bVar9 = false;
    pEVar4 = __return_storage_ptr__;
    local_38 = __return_storage_ptr__;
    do {
      if (*this == (kj)0x25) {
        pkVar8 = this + 1;
        if (pkVar8 != pkVar7) {
          kVar1 = *pkVar8;
          if ((byte)((char)kVar1 - 0x30U) < 10) {
            local_40 = (byte)kVar1 - 0x30;
LAB_004783c7:
            bVar9 = true;
          }
          else {
            if ((byte)((char)kVar1 + 0x9fU) < 6) {
              local_40 = (byte)kVar1 - 0x57;
              goto LAB_004783c7;
            }
            bVar9 = (byte)((char)kVar1 + 0xbfU) < 6;
            if (bVar9) {
              local_40 = (byte)kVar1 - 0x37;
            }
          }
          if (bVar9) {
            pkVar8 = this + 2;
            if (pkVar8 == pkVar7) {
              bVar9 = true;
              kVar1 = SUB41(local_40,0);
            }
            else {
              kVar1 = *pkVar8;
              if ((byte)((char)kVar1 - 0x30U) < 10) {
                uVar2 = (byte)kVar1 - 0x30;
LAB_0047841d:
                bVar10 = true;
LAB_0047841f:
                pEVar4 = (EncodingResult<kj::Array<unsigned_char>_> *)(ulong)uVar2;
              }
              else {
                if ((byte)((char)kVar1 + 0x9fU) < 6) {
                  uVar2 = (byte)kVar1 - 0x57;
                  goto LAB_0047841d;
                }
                bVar10 = (byte)((char)kVar1 + 0xbfU) < 6;
                if (bVar10) {
                  uVar2 = (byte)kVar1 - 0x37;
                  goto LAB_0047841f;
                }
              }
              if (bVar10) {
                local_3c = SUB84(pEVar4,0);
                pkVar8 = this + 3;
              }
              kVar1 = (kj)((byte)(local_40 << 4) | (byte)local_3c);
              bVar9 = bVar6;
              if (!bVar10) {
                bVar9 = true;
                kVar1 = SUB41(local_40,0);
              }
            }
            if (local_68.builder.pos == local_68.builder.endPtr) {
              sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
              if (local_68.builder.endPtr == local_68.builder.ptr) {
                sVar5 = 4;
              }
              Vector<unsigned_char>::setCapacity(&local_68,sVar5);
            }
            *local_68.builder.pos = (RemoveConst<unsigned_char>)kVar1;
            local_68.builder.pos = local_68.builder.pos + 1;
            this = pkVar8;
            bVar6 = bVar9;
            goto LAB_00478492;
          }
        }
        bVar6 = true;
        bVar9 = true;
        this = pkVar8;
      }
      else {
        if ((((uint)text.size_ >> 8 & 1) == 0) || (*this != (kj)0x2b)) {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = (RemoveConst<unsigned_char>)*this;
        }
        else {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = ' ';
        }
        local_68.builder.pos = (RemoveConst<unsigned_char> *)((kj *)local_68.builder.pos + 1);
        this = this + 1;
      }
LAB_00478492:
      __return_storage_ptr__ = local_38;
    } while (this < pkVar7);
  }
  if (((undefined1  [16])text & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (local_68.builder.pos == local_68.builder.endPtr) {
      sVar5 = 4;
      if (local_68.builder.endPtr != local_68.builder.ptr) {
        sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
      }
      Vector<unsigned_char>::setCapacity(&local_68,sVar5);
    }
    *local_68.builder.pos = '\0';
    local_68.builder.pos = local_68.builder.pos + 1;
  }
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<unsigned_char>::setCapacity
              (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
  }
  (__return_storage_ptr__->super_Array<unsigned_char>).ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr;
  (__return_storage_ptr__->super_Array<unsigned_char>).disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar9;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_SOME(d1, tryFromHexDigit(*ptr)) {
        byte b = d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_SOME(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }